

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O0

void MyGame_Example_Alt_print_json_table
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td)

{
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  flatcc_json_printer_table_field
            (ctx,td,0,"prefix",6,MyGame_Example_TestJSONPrefix_print_json_table);
  flatcc_json_printer_table_field(ctx,td,1,"movie",5,Fantasy_Movie_print_json_table);
  flatcc_json_printer_union_vector_field
            (ctx,td,3,"manyany",7,MyGame_Example_Any_print_json_union_type,
             MyGame_Example_Any_print_json_union);
  flatcc_json_printer_table_vector_field
            (ctx,td,4,"multik",6,MyGame_Example_MultipleKeys_print_json_table);
  flatcc_json_printer_struct_vector_field
            (ctx,td,5,"rapunzels",9,8,Fantasy_Rapunzel_print_json_struct);
  flatcc_json_printer_string_vector_field(ctx,td,6,"names",5);
  flatcc_json_printer_float_vector_field(ctx,td,7,"samples",7);
  flatcc_json_printer_struct_field
            (ctx,td,8,"fixed_array",0xb,MyGame_Example_FooBar_print_json_struct);
  return;
}

Assistant:

static void MyGame_Example_Alt_print_json_table(flatcc_json_printer_t *ctx, flatcc_json_printer_table_descriptor_t *td)
{
    flatcc_json_printer_table_field(ctx, td, 0, "prefix", 6, MyGame_Example_TestJSONPrefix_print_json_table);
    flatcc_json_printer_table_field(ctx, td, 1, "movie", 5, Fantasy_Movie_print_json_table);
    flatcc_json_printer_union_vector_field(ctx, td, 3, "manyany", 7, MyGame_Example_Any_print_json_union_type, MyGame_Example_Any_print_json_union);
    flatcc_json_printer_table_vector_field(ctx, td, 4, "multik", 6, MyGame_Example_MultipleKeys_print_json_table);
    flatcc_json_printer_struct_vector_field(ctx, td, 5, "rapunzels", 9, 8, Fantasy_Rapunzel_print_json_struct);
    flatcc_json_printer_string_vector_field(ctx, td, 6, "names", 5);
    flatcc_json_printer_float_vector_field(ctx, td, 7, "samples", 7);
    flatcc_json_printer_struct_field(ctx, td, 8, "fixed_array", 11, MyGame_Example_FooBar_print_json_struct);
}